

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MahjongGB.cpp
# Opt level: O1

vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* MahjongFanCalculator
            (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *pack,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *hand,string *winTile,int flowerCount,bool isZIMO,bool isJUEZHANG,bool isGANG,
            bool isLAST,int menFeng,int quanFeng)

{
  undefined2 uVar1;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  byte *pbVar7;
  string *psVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  pointer pbVar14;
  undefined3 in_register_00000089;
  int *piVar15;
  bool bVar16;
  fan_table_t fan_table;
  allocator local_161;
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
  *local_160;
  int local_158;
  undefined4 local_154;
  string *local_150;
  calculate_param_t local_148;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  uint16_t local_d8 [84];
  
  local_154 = CONCAT31(in_register_00000089,isZIMO);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.hand_tiles.fixed_packs[0] = 0;
  local_148.hand_tiles.fixed_packs[1] = 0;
  local_148.hand_tiles.fixed_packs[2] = 0;
  local_148.hand_tiles.fixed_packs[3] = 0;
  local_148.hand_tiles.fixed_packs[4] = 0;
  local_148.hand_tiles._10_6_ = 0;
  local_148.hand_tiles.pack_count = 0;
  local_148.hand_tiles.standing_tiles[0] = '\0';
  local_148.hand_tiles.standing_tiles[1] = '\0';
  local_148.hand_tiles.standing_tiles[2] = '\0';
  local_148.hand_tiles.standing_tiles[3] = '\0';
  local_148.hand_tiles.standing_tiles[4] = '\0';
  local_148.hand_tiles.standing_tiles[5] = '\0';
  local_148.hand_tiles.standing_tiles[6] = '\0';
  local_148.hand_tiles.standing_tiles[7] = '\0';
  local_148.hand_tiles.standing_tiles[8] = '\0';
  local_148.hand_tiles.standing_tiles[9] = '\0';
  local_148.hand_tiles.standing_tiles[10] = '\0';
  local_148.hand_tiles.standing_tiles[0xb] = '\0';
  local_148.hand_tiles.standing_tiles[0xc] = '\0';
  local_148.hand_tiles._37_3_ = 0;
  local_148.hand_tiles.tile_count = 0;
  local_148.win_tile = '\0';
  local_148.flower_count = '\0';
  local_148.win_flag = '\0';
  local_148._51_1_ = 0;
  local_148.prevalent_wind = EAST;
  local_148.seat_wind = EAST;
  local_148._60_4_ = 0;
  local_160 = (vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  local_158 = flowerCount;
  local_150 = winTile;
  memset(local_d8,0,0xa6);
  local_148.hand_tiles.tile_count =
       (long)(hand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(hand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 5;
  pbVar14 = (hand->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((hand->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
    uVar10 = 1;
    uVar12 = 0;
    do {
      uVar11 = uVar10;
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&str2tile_abi_cxx11_._M_h,pbVar14 + uVar12);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
          ._M_cur == (__node_type *)0x0) {
        psVar8 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar8 = psVar8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>(psVar8,"ERROE_WRONG_TILE_CODE","");
        __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&str2tile_abi_cxx11_,
                            (hand->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar12);
      local_148.hand_tiles.standing_tiles[uVar12] = *pmVar5;
      pbVar14 = (hand->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)((int)uVar11 + 1);
      uVar12 = uVar11;
    } while (uVar11 < (ulong)((long)(hand->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5
                             ));
  }
  local_148.hand_tiles.pack_count =
       ((long)(pack->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(pack->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  ppVar6 = (pack->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pack->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
    uVar10 = 0;
    uVar12 = 1;
    do {
      ppVar6 = ppVar6 + uVar10;
      iVar3 = std::__cxx11::string::compare((char *)ppVar6);
      if (iVar3 == 0) {
        iVar3 = (ppVar6->second).second;
        pbVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&str2tile_abi_cxx11_,&(ppVar6->second).first);
        uVar9 = 0x200;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)ppVar6);
        if (iVar3 == 0) {
          iVar3 = (ppVar6->second).second;
          pbVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&str2tile_abi_cxx11_,&(ppVar6->second).first);
          uVar9 = 0x300;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)ppVar6);
          if (iVar3 != 0) {
            psVar8 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar8 = psVar8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>(psVar8,"ERROE_WRONG_PACK_CODE","");
            __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          iVar3 = (ppVar6->second).second;
          pbVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&str2tile_abi_cxx11_,&(ppVar6->second).first);
          uVar9 = 0x100;
        }
      }
      local_148.hand_tiles.fixed_packs[uVar10] = uVar9 | (ushort)(iVar3 << 0xc) | (ushort)*pbVar7;
      ppVar6 = (pack->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(pack->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3) *
               -0x71c71c71c71c71c7;
      bVar16 = uVar12 <= uVar10;
      lVar13 = uVar10 - uVar12;
      uVar10 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar16 && lVar13 != 0);
  }
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&str2tile_abi_cxx11_,local_150);
  uVar2 = local_148._48_8_;
  local_148.flower_count = (uint8_t)local_158;
  local_148.win_tile = *pmVar5;
  uVar1 = local_148._48_2_;
  if ((char)local_154 != '\0') {
    local_148.win_flag = SUB81(uVar2,2);
    local_148._51_5_ = SUB85(uVar2,3);
    local_148._48_4_ = (uint)CONCAT53(local_148._51_5_,CONCAT12(local_148.win_flag,uVar1)) | 0x10000
    ;
  }
  if (isLAST) {
    local_148._48_4_ = local_148._48_4_ | 0x80000;
  }
  if (isJUEZHANG) {
    local_148._48_4_ = local_148._48_4_ | 0x20000;
  }
  if (isGANG) {
    local_148._48_4_ = local_148._48_4_ | 0x40000;
  }
  local_148.prevalent_wind = quanFeng;
  local_148.seat_wind = menFeng;
  iVar3 = mahjong::calculate_fan(&local_148,(fan_table_t *)local_d8);
  if (iVar3 == -3) {
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar8 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar8,"ERROR_NOT_WIN","");
    __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (iVar3 == -2) {
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar8 = psVar8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar8,"ERROR_TILE_COUNT_GREATER_THAN_4","");
    __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (iVar3 != -1) {
    lVar13 = 0;
    piVar15 = &_ZN7mahjongL8fan_nameE_rel;
    do {
      if (*(ushort *)((long)local_d8 + lVar13) != 0) {
        local_100._0_4_ =
             (uint)*(ushort *)((long)&mahjong::fan_value_table + lVar13) *
             (uint)*(ushort *)((long)local_d8 + lVar13);
        std::__cxx11::string::string
                  ((string *)&local_f8,(char *)((long)&_ZN7mahjongL8fan_nameE_rel + (long)*piVar15),
                   &local_161);
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<std::pair<int,std::__cxx11::string>>
                  (local_160,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
        }
      }
      piVar15 = piVar15 + 1;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 0xa6);
    return (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_160;
  }
  psVar8 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar8 = psVar8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar8,"ERROR_WRONG_TILES_COUNT","");
  __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

vector<pair<int, string> > MahjongFanCalculator(
    vector<pair<string, pair<string, int> > > pack,
    vector<string> hand,
    string winTile,
    int flowerCount,
    bool isZIMO,
    bool isJUEZHANG,
    bool isGANG,
    bool isLAST,
    int menFeng,
    int quanFeng)
{
    vector<pair<int,string>> ans;
    mahjong::calculate_param_t calculate_param;
    mahjong::fan_table_t fan_table;
    memset(&calculate_param, 0, sizeof(mahjong::calculate_param_t));
    memset(&fan_table, 0, sizeof(mahjong::fan_table_t));
    calculate_param.hand_tiles.tile_count = hand.size();
    for(unsigned int i = 0; i < hand.size(); i++) {
        if(str2tile.find(hand[i]) == str2tile.end()){
            throw string("ERROE_WRONG_TILE_CODE");
        }
        calculate_param.hand_tiles.standing_tiles[i] = str2tile[hand[i]];
    }
    calculate_param.hand_tiles.pack_count = pack.size();
    for(unsigned int i = 0; i < pack.size(); i++) {
        pair<string, pair<string, int>> &sPack = pack[i];
        mahjong::pack_t &dPack = calculate_param.hand_tiles.fixed_packs[i];
        if(sPack.first == "PENG") {
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_PUNG, str2tile[sPack.second.first]);
        } else if(sPack.first == "GANG") {
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_KONG, str2tile[sPack.second.first]);
        } else if(sPack.first == "CHI"){
            dPack = mahjong::make_pack(sPack.second.second, PACK_TYPE_CHOW, str2tile[sPack.second.first]);
        } else {
            throw string("ERROE_WRONG_PACK_CODE");
        }
    }
    calculate_param.win_tile = str2tile[winTile];
    calculate_param.flower_count = flowerCount;
    if(isZIMO) {
        calculate_param.win_flag |= WIN_FLAG_SELF_DRAWN;
    }
    if(isLAST) {
        calculate_param.win_flag |= WIN_FLAG_WALL_LAST;
    }
    if(isJUEZHANG) {
        calculate_param.win_flag |= WIN_FLAG_4TH_TILE;
    }
    if(isGANG) {
        calculate_param.win_flag |= WIN_FLAG_ABOUT_KONG;
    }
    calculate_param.prevalent_wind = (mahjong::wind_t)quanFeng;
    calculate_param.seat_wind = (mahjong::wind_t)menFeng;
    int re = mahjong::calculate_fan(&calculate_param, &fan_table);
    if(re == -1) {
        throw string("ERROR_WRONG_TILES_COUNT");
    }else if(re == -2) {
        throw string("ERROR_TILE_COUNT_GREATER_THAN_4");
    }else if(re == -3) {
        throw string("ERROR_NOT_WIN");
    }
    for(int i = 0; i < mahjong::FAN_TABLE_SIZE; i++) {
        if(fan_table[i] > 0) {
            ans.push_back(make_pair(fan_table[i]*mahjong::fan_value_table[i],mahjong::fan_name[i]));
        }
    }
    return ans;
}